

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O0

bool __thiscall
ELFIO::section_impl<ELFIO::Elf32_Shdr>::load
          (section_impl<ELFIO::Elf32_Shdr> *this,istream *stream,streampos header_offset,
          bool is_lazy_)

{
  istream *piVar1;
  bool bVar2;
  int iVar3;
  streamoff sVar4;
  unsigned_long uVar5;
  undefined4 extraout_var;
  element_type *peVar6;
  pointer pcVar7;
  bool bVar8;
  streampos sVar9;
  unique_ptr<char[],_std::default_delete<char[]>_> local_88;
  unique_ptr<char[],_std::default_delete<char[]>_> decompressed_data;
  Elf_Xword uncompressed_size;
  Elf_Xword size;
  bool ret;
  streamoff local_58;
  __mbstate_t local_50;
  undefined1 local_48 [16];
  undefined1 local_31;
  istream *piStack_30;
  bool is_lazy__local;
  istream *stream_local;
  section_impl<ELFIO::Elf32_Shdr> *this_local;
  streampos header_offset_local;
  
  header_offset_local._M_off = (streamoff)header_offset._M_state;
  this_local = (section_impl<ELFIO::Elf32_Shdr> *)header_offset._M_off;
  this->pstream = stream;
  this->is_lazy = is_lazy_;
  local_31 = is_lazy_;
  piStack_30 = stream;
  stream_local = (istream *)this;
  bVar2 = address_translator::empty(this->translator);
  if (bVar2) {
    std::istream::seekg((long)piStack_30,_S_beg);
    local_48 = std::istream::tellg();
    sVar4 = std::fpos::operator_cast_to_long((fpos *)local_48);
    (*(this->super_section)._vptr_section[0x21])(this,sVar4);
  }
  else {
    uVar5 = std::numeric_limits<unsigned_long>::max();
    (*(this->super_section)._vptr_section[0x21])(this,uVar5);
  }
  piVar1 = piStack_30;
  sVar9._M_state.__count = (undefined4)header_offset_local._M_off;
  sVar9._M_state.__value = (anon_union_4_2_91654ee9_for___value)header_offset_local._M_off._4_4_;
  sVar9._M_off = (streamoff)this_local;
  sVar9 = address_translator::operator[](this->translator,sVar9);
  local_58 = sVar9._M_off;
  local_50 = sVar9._M_state;
  std::istream::seekg(piVar1,local_58,local_50);
  std::istream::read((char *)piStack_30,(long)&this->header);
  if (((this->is_lazy & 1U) == 0) && ((this->is_loaded & 1U) == 0)) {
    iVar3 = (*(this->super_section)._vptr_section[0x18])();
    bVar8 = CONCAT44(extraout_var,iVar3) != 0;
    bVar2 = is_compressed(this);
    header_offset_local._M_state.__value.__wchb[3] = bVar8;
    if (bVar2) {
      iVar3 = (*(this->super_section)._vptr_section[0x13])();
      decompressed_data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
           (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0;
      peVar6 = std::
               __shared_ptr_access<ELFIO::compression_interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ELFIO::compression_interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->compression);
      pcVar7 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->data);
      (**(code **)(*(long *)peVar6 + 0x10))
                (&local_88,peVar6,pcVar7,this->convertor,iVar3,&decompressed_data);
      bVar2 = std::operator!=(&local_88,(nullptr_t)0x0);
      if (bVar2) {
        (*(this->super_section)._vptr_section[0x14])(this,&decompressed_data);
        std::unique_ptr<char[],_std::default_delete<char[]>_>::operator=(&this->data,&local_88);
      }
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&local_88);
    }
  }
  else {
    header_offset_local._M_state.__value.__wchb[3] = '\x01';
  }
  return (bool)header_offset_local._M_state.__value.__wchb[3];
}

Assistant:

bool load( std::istream&  stream,
               std::streampos header_offset,
               bool           is_lazy_ ) override
    {
        pstream = &stream;
        is_lazy = is_lazy_;

        if ( translator->empty() ) {
            stream.seekg( 0, std::istream::end );
            set_stream_size( size_t( stream.tellg() ) );
        }
        else {
            set_stream_size( std::numeric_limits<size_t>::max() );
        }

        stream.seekg( ( *translator )[header_offset] );
        stream.read( reinterpret_cast<char*>( &header ), sizeof( header ) );

        if ( !( is_lazy || is_loaded ) ) {
            bool ret = get_data();

            if ( is_compressed() ) {
                Elf_Xword size              = get_size();
                Elf_Xword uncompressed_size = 0;
                auto      decompressed_data = compression->inflate(
                    data.get(), convertor, size, uncompressed_size );
                if ( decompressed_data != nullptr ) {
                    set_size( uncompressed_size );
                    data = std::move( decompressed_data );
                }
            }

            return ret;
        }

        return true;
    }